

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O3

upb_Message *
upb_Message_GetOrCreateMutableMessage
          (upb_Message *msg,upb_MiniTable *mini_table,upb_MiniTableField *f,upb_Arena *arena)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  upb_Message *__s;
  ulong size;
  
  if (arena == (upb_Arena *)0x0) {
    __assert_fail("arena",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x21c,
                  "struct upb_Message *upb_Message_GetOrCreateMutableMessage(struct upb_Message *, const upb_MiniTable *, const upb_MiniTableField *, upb_Arena *)"
                 );
  }
  bVar2 = f->descriptortype_dont_copy_me__upb_internal_use_only;
  if ((f->mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
    if ((bVar2 & 0xfe) == 10) {
      if ((f->mode_dont_copy_me__upb_internal_use_only & 8) != 0) {
        __assert_fail("!upb_MiniTableField_IsExtension(f)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                      ,0x21e,
                      "struct upb_Message *upb_Message_GetOrCreateMutableMessage(struct upb_Message *, const upb_MiniTable *, const upb_MiniTableField *, upb_Arena *)"
                     );
      }
      __s = *(upb_Message **)
             ((long)&msg->field_0 + (ulong)f->offset_dont_copy_me__upb_internal_use_only);
      if (__s == (upb_Message *)0x0) {
        if (*mini_table->subs_dont_copy_me__upb_internal_use_only
             [f->submsg_index_dont_copy_me__upb_internal_use_only].
             submsg_dont_copy_me__upb_internal_use_only == (upb_MiniTable *)0x0) {
          __assert_fail("sub_mini_table",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                        ,0x224,
                        "struct upb_Message *upb_Message_GetOrCreateMutableMessage(struct upb_Message *, const upb_MiniTable *, const upb_MiniTableField *, upb_Arena *)"
                       );
        }
        uVar3 = (*mini_table->subs_dont_copy_me__upb_internal_use_only
                  [f->submsg_index_dont_copy_me__upb_internal_use_only].
                  submsg_dont_copy_me__upb_internal_use_only)->
                size_dont_copy_me__upb_internal_use_only;
        size = (ulong)(uVar3 + 7 & 0xfffffff8);
        __s = (upb_Message *)arena->ptr_dont_copy_me__upb_internal_use_only;
        if ((ulong)((long)arena->end_dont_copy_me__upb_internal_use_only - (long)__s) < size) {
          __s = (upb_Message *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(arena,size)
          ;
        }
        else {
          if ((upb_Message *)((ulong)((long)&__s->field_0 + 7U) & 0xfffffffffffffff8) != __s) {
            __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                          ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
          }
          arena->ptr_dont_copy_me__upb_internal_use_only = (char *)((long)&__s->field_0 + size);
        }
        if (__s != (upb_Message *)0x0) {
          memset(__s,0,(ulong)uVar3);
        }
        *(upb_Message **)
         ((long)&msg->field_0 + (ulong)f->offset_dont_copy_me__upb_internal_use_only) = __s;
        uVar3 = f->presence;
        if ((short)uVar3 < 1) {
          if ((short)uVar3 < 0) {
            *(uint32_t *)((long)&msg->field_0 + (ulong)(uVar3 ^ 0xffff)) =
                 f->number_dont_copy_me__upb_internal_use_only;
          }
        }
        else {
          pbVar1 = (byte *)((long)&msg->field_0 + (ulong)(uVar3 >> 3));
          *pbVar1 = *pbVar1 | '\x01' << ((byte)uVar3 & 7);
        }
      }
      return __s;
    }
  }
  else if ((bVar2 != 5) && (bVar2 != 0xc)) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                  ,0x7b,"upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
  }
  __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Message",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x21d,
                "struct upb_Message *upb_Message_GetOrCreateMutableMessage(struct upb_Message *, const upb_MiniTable *, const upb_MiniTableField *, upb_Arena *)"
               );
}

Assistant:

UPB_API_INLINE struct upb_Message* upb_Message_GetOrCreateMutableMessage(
    struct upb_Message* msg, const upb_MiniTable* mini_table,
    const upb_MiniTableField* f, upb_Arena* arena) {
  UPB_ASSERT(arena);
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Message);
  UPB_ASSUME(!upb_MiniTableField_IsExtension(f));
  struct upb_Message* sub_message =
      *UPB_PTR_AT(msg, f->UPB_ONLYBITS(offset), struct upb_Message*);
  if (!sub_message) {
    const upb_MiniTable* sub_mini_table =
        upb_MiniTable_SubMessage(mini_table, f);
    UPB_ASSERT(sub_mini_table);
    sub_message = _upb_Message_New(sub_mini_table, arena);
    *UPB_PTR_AT(msg, f->UPB_ONLYBITS(offset), struct upb_Message*) =
        sub_message;
    UPB_PRIVATE(_upb_Message_SetPresence)(msg, f);
  }
  return sub_message;
}